

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void btSoftBody::PSolve_RContacts(btSoftBody *psb,btScalar kst,btScalar ti)

{
  float fVar1;
  float fVar2;
  float fVar3;
  RContact *pRVar4;
  btRigidBody *pbVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  btRigidBody *this;
  float extraout_XMM0_Da;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 in_XMM1_Db;
  float fVar13;
  float fVar14;
  float fVar15;
  btVector3 bVar16;
  btVector3 local_40;
  
  fVar1 = (psb->m_sst).sdt;
  (*((psb->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])
            (fVar1,CONCAT44(in_XMM1_Db,ti));
  lVar7 = (long)(psb->m_rcontacts).m_size;
  if (0 < lVar7) {
    lVar8 = 0;
    do {
      pRVar4 = (psb->m_rcontacts).m_data;
      pbVar5 = *(btRigidBody **)((long)(pRVar4->m_cti).m_normal.m_floats + lVar8 + -8);
      if (((pbVar5->super_btCollisionObject).m_collisionFlags & 4) == 0) {
        this = (btRigidBody *)0x0;
        if (((pbVar5->super_btCollisionObject).m_internalType & 2) != 0) {
          this = pbVar5;
        }
        if (this == (btRigidBody *)0x0) {
          fVar9 = 0.0;
          fVar10 = 0.0;
          fVar11 = 0.0;
        }
        else {
          bVar16 = btRigidBody::getVelocityInLocalPoint
                             (this,(btVector3 *)((long)(pRVar4->m_c1).m_floats + lVar8));
          fVar9 = bVar16.m_floats[0] * fVar1;
          fVar10 = bVar16.m_floats[1] * fVar1;
          fVar11 = bVar16.m_floats[2] * fVar1;
        }
        lVar6 = *(long *)((long)(pRVar4->m_c0).m_el[0].m_floats + lVar8 + -8);
        fVar9 = (*(float *)(lVar6 + 0x10) - *(float *)(lVar6 + 0x20)) - fVar9;
        fVar10 = (*(float *)(lVar6 + 0x14) - *(float *)(lVar6 + 0x24)) - fVar10;
        fVar11 = (*(float *)(lVar6 + 0x18) - *(float *)(lVar6 + 0x28)) - fVar11;
        fVar13 = *(float *)((long)(pRVar4->m_cti).m_normal.m_floats + lVar8);
        fVar14 = *(float *)((long)(pRVar4->m_cti).m_normal.m_floats + lVar8 + 4);
        fVar2 = *(float *)((long)(pRVar4->m_cti).m_normal.m_floats + lVar8 + 8);
        fVar15 = fVar11 * fVar2 + fVar9 * fVar13 + fVar10 * fVar14;
        if (fVar15 <= 1.1920929e-07) {
          fVar12 = *(float *)(lVar6 + 0x18) * fVar2 +
                   *(float *)(lVar6 + 0x10) * fVar13 + *(float *)(lVar6 + 0x14) * fVar14 +
                   *(float *)((long)(&(pRVar4->m_cti).m_normal + 1) + lVar8);
          if (extraout_XMM0_Da <= fVar12) {
            fVar12 = extraout_XMM0_Da;
          }
          fVar3 = *(float *)((long)(&pRVar4->m_c1 + 1) + lVar8 + 4);
          fVar12 = fVar12 * *(float *)((long)(&pRVar4->m_c1 + 1) + lVar8 + 8);
          fVar9 = (fVar13 * fVar12 + (fVar9 - (fVar9 - fVar13 * fVar15) * fVar3)) * kst;
          fVar13 = (fVar14 * fVar12 + (fVar10 - (fVar10 - fVar14 * fVar15) * fVar3)) * kst;
          fVar10 = (fVar12 * fVar2 + (fVar11 - (fVar11 - fVar15 * fVar2) * fVar3)) * kst;
          fVar14 = *(float *)((long)(pRVar4->m_c0).m_el[2].m_floats + lVar8 + 8) * fVar10 +
                   *(float *)((long)(pRVar4->m_c0).m_el[2].m_floats + lVar8) * fVar9 +
                   *(float *)((long)(pRVar4->m_c0).m_el[2].m_floats + lVar8 + 4) * fVar13;
          fVar11 = fVar10 * *(float *)((long)(pRVar4->m_c0).m_el[0].m_floats + lVar8 + 8) +
                   fVar9 * *(float *)((long)(pRVar4->m_c0).m_el[0].m_floats + lVar8) +
                   fVar13 * *(float *)((long)(pRVar4->m_c0).m_el[0].m_floats + lVar8 + 4);
          fVar10 = fVar10 * *(float *)((long)(pRVar4->m_c0).m_el[1].m_floats + lVar8 + 8) +
                   fVar9 * *(float *)((long)(pRVar4->m_c0).m_el[1].m_floats + lVar8) +
                   fVar13 * *(float *)((long)(pRVar4->m_c0).m_el[1].m_floats + lVar8 + 4);
          local_40.m_floats[1] = fVar10;
          local_40.m_floats[0] = fVar11;
          local_40.m_floats[2] = fVar14;
          local_40.m_floats[3] = 0.0;
          fVar9 = *(float *)((long)(&pRVar4->m_c1 + 1) + lVar8);
          lVar6 = *(long *)((long)(pRVar4->m_c0).m_el[0].m_floats + lVar8 + -8);
          *(ulong *)(lVar6 + 0x10) =
               CONCAT44((float)((ulong)*(undefined8 *)(lVar6 + 0x10) >> 0x20) - fVar9 * fVar10,
                        (float)*(undefined8 *)(lVar6 + 0x10) - fVar9 * fVar11);
          *(float *)(lVar6 + 0x18) = *(float *)(lVar6 + 0x18) - fVar14 * fVar9;
          if (this != (btRigidBody *)0x0) {
            btRigidBody::applyImpulse
                      (this,&local_40,(btVector3 *)((long)(pRVar4->m_c1).m_floats + lVar8));
          }
        }
      }
      lVar8 = lVar8 + 0x78;
    } while (lVar7 * 0x78 - lVar8 != 0);
  }
  return;
}

Assistant:

void btSoftBody::PSolve_RContacts(btSoftBody* psb, btScalar kst, btScalar ti)
{
	const btScalar	dt = psb->m_sst.sdt;
	const btScalar	mrg = psb->getCollisionShape()->getMargin();
	for(int i=0,ni=psb->m_rcontacts.size();i<ni;++i)
	{
		const RContact&		c = psb->m_rcontacts[i];
		const sCti&			cti = c.m_cti;	
		if (cti.m_colObj->hasContactResponse()) 
		{
			btRigidBody* tmpRigid = (btRigidBody*)btRigidBody::upcast(cti.m_colObj);
			const btVector3		va = tmpRigid ? tmpRigid->getVelocityInLocalPoint(c.m_c1)*dt : btVector3(0,0,0);
			const btVector3		vb = c.m_node->m_x-c.m_node->m_q;	
			const btVector3		vr = vb-va;
			const btScalar		dn = btDot(vr, cti.m_normal);		
			if(dn<=SIMD_EPSILON)
			{
				const btScalar		dp = btMin( (btDot(c.m_node->m_x, cti.m_normal) + cti.m_offset), mrg );
				const btVector3		fv = vr - (cti.m_normal * dn);
				// c0 is the impulse matrix, c3 is 1 - the friction coefficient or 0, c4 is the contact hardness coefficient
				const btVector3		impulse = c.m_c0 * ( (vr - (fv * c.m_c3) + (cti.m_normal * (dp * c.m_c4))) * kst );
				c.m_node->m_x -= impulse * c.m_c2;
				if (tmpRigid)
					tmpRigid->applyImpulse(impulse,c.m_c1);
			}
		}
	}
}